

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O2

int64_t __thiscall
icu_63::CollationRootElements::firstCEWithPrimaryAtLeast(CollationRootElements *this,uint32_t p)

{
  int32_t iVar1;
  uint *puVar2;
  ulong uVar3;
  
  if (p == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)p;
    iVar1 = findP(this,p);
    if ((this->elements[iVar1] & 0xffffff00) != p) {
      puVar2 = this->elements + iVar1;
      do {
        puVar2 = puVar2 + 1;
        uVar3 = (ulong)*puVar2;
      } while ((char)*puVar2 < '\0');
    }
    uVar3 = uVar3 << 0x20 | 0x5000500;
  }
  return uVar3;
}

Assistant:

int64_t
CollationRootElements::firstCEWithPrimaryAtLeast(uint32_t p) const {
    if(p == 0) { return 0; }
    int32_t index = findP(p);
    if(p != (elements[index] & 0xffffff00)) {
        for(;;) {
            p = elements[++index];
            if((p & SEC_TER_DELTA_FLAG) == 0) {
                // First primary after p. We must not be in a primary range.
                U_ASSERT((p & PRIMARY_STEP_MASK) == 0);
                break;
            }
        }
    }
    // The code above guarantees that p has at most 3 bytes: (p & 0xff) == 0.
    return ((int64_t)p << 32) | Collation::COMMON_SEC_AND_TER_CE;
}